

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O0

void us_internal_async_close(us_internal_async *a)

{
  int __fd;
  us_loop_t *in_RDI;
  us_poll_t *unaff_retaddr;
  us_internal_callback_t *cb;
  us_loop_t *in_stack_ffffffffffffffe8;
  
  us_poll_stop(unaff_retaddr,in_RDI);
  __fd = us_poll_fd((us_poll_t *)in_RDI);
  close(__fd);
  us_poll_free((us_poll_t *)in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void us_internal_async_close(struct us_internal_async *a) {
    struct us_internal_callback_t *cb = (struct us_internal_callback_t *) a;

    us_poll_stop(&cb->p, cb->loop);
    close(us_poll_fd(&cb->p));

    /* (regular) sockets are the only polls which are not freed immediately */
    us_poll_free((struct us_poll_t *) a, cb->loop);
}